

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
cppmetrics::WeightedSnapshot::get_values
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,WeightedSnapshot *this)

{
  pointer pEVar1;
  pointer pEVar2;
  long local_28;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->m_elements).
                    super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_elements).
                   super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pEVar1 = (this->m_elements).
           super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (this->m_elements).
                super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    local_28 = pEVar2->value;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>(__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<long> WeightedSnapshot::get_values() const
{
  std::vector<long> values;
  values.reserve(m_elements.size());
  std::transform(
      std::begin(m_elements),
      std::end(m_elements),
      std::back_inserter(values),
      [](const Element& elem) { return elem.value; }
  );
  return values;
}